

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_byte_array_stop_encode_store(cram_codec *c,cram_block *b,char *prefix,int version)

{
  size_t sVar1;
  size_t __n;
  uchar *puVar2;
  long lVar3;
  byte *pbVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double local_180;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  char local_80;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  double local_60;
  size_t l;
  char *cp;
  char buf [20];
  int local_28;
  int len;
  int version_local;
  char *prefix_local;
  cram_block *b_local;
  cram_codec *c_local;
  
  local_28 = 0;
  if (prefix != (char *)0x0) {
    __n = strlen(prefix);
    while (b->alloc <= b->byte + __n) {
      if (b->alloc == 0) {
        local_60 = 1024.0;
      }
      else {
        sVar1 = b->alloc;
        auVar5._8_4_ = (int)(sVar1 >> 0x20);
        auVar5._0_8_ = sVar1;
        auVar5._12_4_ = 0x45300000;
        local_60 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
      }
      b->alloc = (long)local_60 | (long)(local_60 - 9.223372036854776e+18) & (long)local_60 >> 0x3f;
      puVar2 = (uchar *)realloc(b->data,b->alloc);
      b->data = puVar2;
    }
    memcpy(b->data + b->byte,prefix,__n);
    b->byte = __n + b->byte;
    local_28 = (int)__n;
  }
  if ((c->codec & 0xffffff80) == E_NULL) {
    cp._0_1_ = (byte)c->codec;
    local_64 = 1;
  }
  else {
    if ((c->codec & 0xffffc000) == E_NULL) {
      cp._0_1_ = (byte)(c->codec >> 8) | 0x80;
      cp._1_1_ = (undefined1)c->codec;
      local_68 = 2;
    }
    else {
      if ((c->codec & 0xffe00000) == E_NULL) {
        cp._0_1_ = (byte)(c->codec >> 0x10) | 0xc0;
        cp._1_1_ = (undefined1)(c->codec >> 8);
        cp._2_1_ = (undefined1)c->codec;
        local_6c = 3;
      }
      else {
        if ((c->codec & 0xf0000000) == E_NULL) {
          cp._0_1_ = (byte)(c->codec >> 0x18) | 0xe0;
          cp._1_1_ = (undefined1)(c->codec >> 0x10);
          cp._2_1_ = (undefined1)(c->codec >> 8);
          cp._3_1_ = (undefined1)c->codec;
          local_70 = 4;
        }
        else {
          cp._0_1_ = (byte)(c->codec >> 0x1c) | 0xf0;
          cp._1_1_ = (undefined1)(c->codec >> 0x14);
          cp._2_1_ = (undefined1)(c->codec >> 0xc);
          cp._3_1_ = (undefined1)(c->codec >> 4);
          cp._4_1_ = (byte)c->codec & 0xf;
          local_70 = 5;
        }
        local_6c = local_70;
      }
      local_68 = local_6c;
    }
    local_64 = local_68;
  }
  lVar3 = (long)local_64;
  if (version >> 8 == 1) {
    buf[lVar3 + -8] = '\x05';
    buf[lVar3 + -7] = (c->field_6).byte_array_stop.stop;
    buf[lVar3 + -6] = (char)(c->field_6).external.type;
    buf[lVar3 + -5] = (char)((c->field_6).external.type >> 8);
    buf[lVar3 + -4] = (char)((c->field_6).external.type >> 0x10);
    l = (size_t)(buf + lVar3 + -2);
    buf[lVar3 + -3] = (char)((c->field_6).external.type >> 0x18);
  }
  else {
    if (((c->field_6).external.type & 0xffffff80) == 0) {
      local_80 = '\x01';
    }
    else if (((c->field_6).external.type & 0xffffc000) == 0) {
      local_80 = '\x02';
    }
    else if (((c->field_6).external.type & 0xffe00000) == 0) {
      local_80 = '\x03';
    }
    else {
      local_80 = '\x05';
      if (((c->field_6).external.type & 0xf0000000) == 0) {
        local_80 = '\x04';
      }
    }
    buf[lVar3 + -8] = local_80 + '\x01';
    pbVar4 = (byte *)(buf + lVar3 + -6);
    buf[lVar3 + -7] = (c->field_6).byte_array_stop.stop;
    if (((c->field_6).external.type & 0xffffff80) == 0) {
      *pbVar4 = (byte)(c->field_6).external.type;
      local_168 = 1;
    }
    else {
      if (((c->field_6).external.type & 0xffffc000) == 0) {
        *pbVar4 = (byte)((c->field_6).external.type >> 8) | 0x80;
        buf[lVar3 + -5] = (char)(c->field_6).external.type;
        local_16c = 2;
      }
      else {
        if (((c->field_6).external.type & 0xffe00000) == 0) {
          *pbVar4 = (byte)((c->field_6).external.type >> 0x10) | 0xc0;
          buf[lVar3 + -5] = (char)((c->field_6).external.type >> 8);
          buf[lVar3 + -4] = (char)(c->field_6).external.type;
          local_170 = 3;
        }
        else {
          if (((c->field_6).external.type & 0xf0000000) == 0) {
            *pbVar4 = (byte)((c->field_6).external.type >> 0x18) | 0xe0;
            buf[lVar3 + -5] = (char)((c->field_6).external.type >> 0x10);
            buf[lVar3 + -4] = (char)((c->field_6).external.type >> 8);
            buf[lVar3 + -3] = (char)(c->field_6).external.type;
            local_174 = 4;
          }
          else {
            *pbVar4 = (byte)((c->field_6).beta.nbits >> 0x1c) | 0xf0;
            buf[lVar3 + -5] = (char)((c->field_6).beta.nbits >> 0x14);
            buf[lVar3 + -4] = (char)((c->field_6).beta.nbits >> 0xc);
            buf[lVar3 + -3] = (char)((c->field_6).beta.nbits >> 4);
            buf[lVar3 + -2] = (byte)(c->field_6).external.type & 0xf;
            local_174 = 5;
          }
          local_170 = local_174;
        }
        local_16c = local_170;
      }
      local_168 = local_16c;
    }
    l = (size_t)(pbVar4 + local_168);
  }
  while (b->alloc <= b->byte + (l - (long)&cp)) {
    if (b->alloc == 0) {
      local_180 = 1024.0;
    }
    else {
      sVar1 = b->alloc;
      auVar6._8_4_ = (int)(sVar1 >> 0x20);
      auVar6._0_8_ = sVar1;
      auVar6._12_4_ = 0x45300000;
      local_180 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
    }
    b->alloc = (long)local_180 | (long)(local_180 - 9.223372036854776e+18) & (long)local_180 >> 0x3f
    ;
    puVar2 = (uchar *)realloc(b->data,b->alloc);
    b->data = puVar2;
  }
  memcpy(b->data + b->byte,&cp,l - (long)&cp);
  b->byte = (l - (long)&cp) + b->byte;
  return local_28 + ((int)l - (int)&cp);
}

Assistant:

int cram_byte_array_stop_encode_store(cram_codec *c, cram_block *b,
				      char *prefix, int version) {
    int len = 0;
    char buf[20], *cp = buf;

    if (prefix) {
	size_t l = strlen(prefix);
	BLOCK_APPEND(b, prefix, l);
	len += l;
    }

    cp += itf8_put(cp, c->codec);

    if (CRAM_MAJOR_VERS(version) == 1) {
	cp += itf8_put(cp, 5);
	*cp++ = c->e_byte_array_stop.stop;
	*cp++ = (c->e_byte_array_stop.content_id >>  0) & 0xff;
	*cp++ = (c->e_byte_array_stop.content_id >>  8) & 0xff;
	*cp++ = (c->e_byte_array_stop.content_id >> 16) & 0xff;
	*cp++ = (c->e_byte_array_stop.content_id >> 24) & 0xff;
    } else {
	cp += itf8_put(cp, 1 + itf8_size(c->e_byte_array_stop.content_id));
	*cp++ = c->e_byte_array_stop.stop;
	cp += itf8_put(cp, c->e_byte_array_stop.content_id);
    }

    BLOCK_APPEND(b, buf, cp-buf);
    len += cp-buf;

    return len;
}